

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void P_SetupPortals(void)

{
  double dVar1;
  sector_t *psVar2;
  AStackPoint *pAVar3;
  uint uVar4;
  PClass *pPVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  int iVar8;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *obj;
  FSectorPortal *pFVar9;
  long lVar10;
  FSectorPortal *s;
  FSectorPortal *pFVar11;
  TObjPtr<AActor> *obj_00;
  FName local_8c;
  AStackPoint *pt;
  NActorIterator local_80;
  FSectorPortal *local_68;
  double dStack_60;
  TArray<AStackPoint_*,_AStackPoint_*> points;
  TThinkerIterator<AStackPoint> it;
  
  TThinkerIterator<AStackPoint>::TThinkerIterator
            ((TThinkerIterator<AStackPoint> *)&it.super_FThinkerIterator,0x80);
  points.Array = (AStackPoint **)0x0;
  points.Most = 0;
  points.Count = 0;
  while( true ) {
    pt = (AStackPoint *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
    if ((DThinker *)pt == (DThinker *)0x0) break;
    pPVar5 = DObject::GetClass((DObject *)pt);
    pAVar3 = pt;
    iVar8 = (pPVar5->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index;
    if (iVar8 == 0x3f) {
      local_80.super_FActorIterator.id = (pt->super_ASkyViewpoint).super_AActor.tid;
      local_80.super_FActorIterator.base = (AActor *)0x0;
      local_8c.Index = 0x3e;
      local_80.type = PClass::FindClass(&local_8c);
      psVar2 = (pAVar3->super_ASkyViewpoint).super_AActor.Sector;
      pAVar6 = NActorIterator::Next(&local_80);
      if (pAVar6 != (AActor *)0x0) {
        (pAVar6->target).field_0.p = (AActor *)pAVar3;
        dVar1 = psVar2->planes[1].alpha;
        if ((dVar1 == 1.0) && (!NAN(dVar1))) {
          iVar8 = (pAVar3->super_ASkyViewpoint).super_AActor.args[0];
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          psVar2->planes[1].alpha = (double)iVar8 / 255.0;
        }
        uVar4 = P_GetStackPortal(pAVar6,1);
        psVar2->Portals[1] = uVar4;
      }
    }
    else if (iVar8 == 0x3e) {
      local_80.super_FActorIterator.id = (pt->super_ASkyViewpoint).super_AActor.tid;
      local_80.super_FActorIterator.base = (AActor *)0x0;
      local_8c.Index = 0x3f;
      local_80.type = PClass::FindClass(&local_8c);
      psVar2 = (pAVar3->super_ASkyViewpoint).super_AActor.Sector;
      pAVar6 = NActorIterator::Next(&local_80);
      if (pAVar6 != (AActor *)0x0) {
        (pAVar6->target).field_0.p = (AActor *)pAVar3;
        dVar1 = psVar2->planes[0].alpha;
        if ((dVar1 == 1.0) && (!NAN(dVar1))) {
          iVar8 = (pAVar3->super_ASkyViewpoint).super_AActor.args[0];
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          psVar2->planes[0].alpha = (double)iVar8 / 255.0;
        }
        uVar4 = P_GetStackPortal(pAVar6,0);
        psVar2->Portals[0] = uVar4;
      }
    }
    (pt->super_ASkyViewpoint).super_AActor.special1 = 0;
    TArray<AStackPoint_*,_AStackPoint_*>::Push(&points,&pt);
  }
  local_68 = sectorPortals.Array + sectorPortals.Count;
  pt = (AStackPoint *)0x0;
  for (pFVar11 = sectorPortals.Array; pFVar11 != local_68; pFVar11 = pFVar11 + 1) {
    if (pFVar11->mType == 1) {
      pAVar6 = GC::ReadBarrier<AActor>((AActor **)&pFVar11->mSkybox);
      if (pAVar6 != (AActor *)0x0) {
        obj_00 = &(sectorPortals.Array)->mSkybox;
        pFVar9 = sectorPortals.Array;
        for (lVar10 = (ulong)sectorPortals.Count << 6; lVar10 != 0; lVar10 = lVar10 + -0x40) {
          if (((FSectorPortal *)(obj_00 + -7))->mType == 1) {
            pAVar6 = GC::ReadBarrier<AActor>((AActor **)&pFVar11->mSkybox);
            pAVar6 = GC::ReadBarrier<AActor>((AActor **)&pAVar6->target);
            pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj_00);
            if (pAVar7 == pAVar6) {
              pFVar11->mPartner = (uint)((ulong)((long)pFVar9 - (long)sectorPortals.Array) >> 6);
            }
          }
          pFVar9 = pFVar9 + 1;
          obj_00 = obj_00 + 8;
        }
      }
    }
  }
  obj = &((sectorPortals.Array)->mSkybox).field_0;
  for (lVar10 = (ulong)sectorPortals.Count << 6; lVar10 != 0; lVar10 = lVar10 + -0x40) {
    if (*(int *)(obj + -7) == 1) {
      pAVar6 = GC::ReadBarrier<AActor>(&obj->p);
      if (pAVar6 != (AActor *)0x0) {
        pAVar6 = GC::ReadBarrier<AActor>(&obj->p);
        local_68 = (FSectorPortal *)(pAVar6->__Pos).X;
        dStack_60 = (pAVar6->__Pos).Y;
        pAVar6 = GC::ReadBarrier<AActor>(&obj->p);
        pAVar6 = GC::ReadBarrier<AActor>((AActor **)&pAVar6->target);
        dVar1 = (pAVar6->__Pos).Y;
        obj[-3] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                  ((double)local_68 - (pAVar6->__Pos).X);
        obj[-2] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)(dStack_60 - dVar1);
        obj->p = (AActor *)0x0;
      }
    }
    obj = obj + 8;
  }
  TArray<AStackPoint_*,_AStackPoint_*>::~TArray(&points);
  return;
}

Assistant:

void P_SetupPortals()
{
	TThinkerIterator<AStackPoint> it;
	AStackPoint *pt;
	TArray<AStackPoint *> points;

	while ((pt = it.Next()))
	{
		FName nm = pt->GetClass()->TypeName;
		if (nm == NAME_UpperStackLookOnly)
		{
			SetupFloorPortal(pt);
		}
		else if (nm == NAME_LowerStackLookOnly)
		{
			SetupCeilingPortal(pt);
		}
		pt->special1 = 0;
		points.Push(pt);
	}
	// the semantics here are incredibly lax so the final setup can only be done once all portals have been created,
	// because later stackpoints will happily overwrite info in older ones, if there are multiple links.
	for (auto &s : sectorPortals)
	{
		if (s.mType == PORTS_STACKEDSECTORTHING && s.mSkybox)
		{
			for (auto &ss : sectorPortals)
			{
				if (ss.mType == PORTS_STACKEDSECTORTHING && ss.mSkybox == s.mSkybox->target)
				{
					s.mPartner = unsigned((&ss) - &sectorPortals[0]);
				}
			}
		}
	}
	// Now we can finally set the displacement and delete the stackpoint reference.
	for (auto &s : sectorPortals)
	{
		if (s.mType == PORTS_STACKEDSECTORTHING && s.mSkybox)
		{
			s.mDisplacement = s.mSkybox->Pos() - s.mSkybox->target->Pos();
			s.mSkybox = NULL;
		}
	}
}